

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrollarea.cpp
# Opt level: O2

QWidget * __thiscall QtMWidgets::ScrollArea::takeWidget(ScrollArea *this)

{
  AbstractScrollAreaPrivate *pAVar1;
  AbstractScrollArea *pAVar2;
  
  pAVar1 = (this->super_AbstractScrollArea).d.d;
  if ((pAVar1[1]._vptr_AbstractScrollAreaPrivate == (_func_int **)0x0) ||
     (*(int *)((long)pAVar1[1]._vptr_AbstractScrollAreaPrivate + 4) == 0)) {
    pAVar2 = (AbstractScrollArea *)0x0;
  }
  else {
    pAVar2 = pAVar1[1].q;
  }
  QObject::removeEventFilter((QObject *)pAVar2);
  QWidget::setParent(&pAVar1->horIndicator->super_QWidget);
  QWidget::setParent(&pAVar1->vertIndicator->super_QWidget);
  QWidget::setParent(&pAVar1->horBlur->super_QWidget);
  QWidget::setParent(&pAVar1->vertBlur->super_QWidget);
  QWeakPointer<QObject>::assign<QObject>((QWeakPointer<QObject> *)(pAVar1 + 1),(QObject *)0x0);
  QWidget::setParent((QWidget *)pAVar2);
  return (QWidget *)pAVar2;
}

Assistant:

QWidget *
ScrollArea::takeWidget()
{
	ScrollAreaPrivate * d = d_func();
	QWidget * w = d->widget;
	w->removeEventFilter( this );
	d->horIndicator->setParent( d->viewport );
	d->vertIndicator->setParent( d->viewport );
	d->horBlur->setParent( d->viewport );
	d->vertBlur->setParent( d->viewport );
	d->widget = 0;
	if( w )
		w->setParent( 0 );
	return w;
}